

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

AssertionExpr *
slang::ast::StrongWeakAssertionExpr::fromSyntax
          (StrongWeakPropertyExprSyntax *syntax,ASTContext *context)

{
  int iVar1;
  Compilation *args;
  SequenceExprSyntax *pSVar2;
  undefined4 extraout_var;
  StrongWeakAssertionExpr *pSVar3;
  BumpAllocator *in_RSI;
  AssertionExpr *expr;
  Compilation *comp;
  SyntaxNode *in_stack_000000b8;
  NondegeneracyRequirement in_stack_000000c4;
  ASTContext *in_stack_000000c8;
  AssertionExpr *in_stack_000000d0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  AssertionExpr *this;
  
  args = ASTContext::getCompilation((ASTContext *)0xb619b8);
  pSVar2 = not_null<slang::syntax::SequenceExprSyntax_*>::operator*
                     ((not_null<slang::syntax::SequenceExprSyntax_*> *)0xb619cb);
  iVar1 = AssertionExpr::bind((int)pSVar2,(sockaddr *)in_RSI,0);
  this = (AssertionExpr *)CONCAT44(extraout_var,iVar1);
  AssertionExpr::requireSequence
            (this,(ASTContext *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  enforceNondegeneracy(in_stack_000000d0,in_stack_000000c8,in_stack_000000c4,in_stack_000000b8);
  pSVar3 = BumpAllocator::
           emplace<slang::ast::StrongWeakAssertionExpr,slang::ast::AssertionExpr_const&,slang::ast::StrongWeakAssertionExpr::Strength>
                     (in_RSI,(AssertionExpr *)args,&this->kind);
  return &pSVar3->super_AssertionExpr;
}

Assistant:

AssertionExpr& StrongWeakAssertionExpr::fromSyntax(const StrongWeakPropertyExprSyntax& syntax,
                                                   const ASTContext& context) {
    auto& comp = context.getCompilation();
    auto& expr = bind(*syntax.expr, context);
    expr.requireSequence(context);
    enforceNondegeneracy(expr, context, NondegeneracyRequirement::Default, syntax);

    return *comp.emplace<StrongWeakAssertionExpr>(
        expr, syntax.keyword.kind == TokenKind::StrongKeyword ? Strong : Weak);
}